

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-def.cpp
# Opt level: O1

void __thiscall JitFFI::JitFuncCallerCreaterX64::call_func(JitFuncCallerCreaterX64 *this,void *func)

{
  JitFuncCreater *pJVar1;
  size_t in_RCX;
  void *local_20;
  
  pJVar1 = this->data;
  JitFuncCreater::push(pJVar1,'H');
  JitFuncCreater::push(pJVar1,0xb8);
  local_20 = func;
  JitFuncCreater::write(pJVar1,(int)&local_20,(void *)0x8,in_RCX);
  pJVar1 = this->data;
  JitFuncCreater::push(pJVar1,0xff);
  JitFuncCreater::push(pJVar1,0xd0);
  return;
}

Assistant:

void JitFuncCallerCreaterX64::call_func(void *func) {
		OpCode_x64::movq_u64(data, OpCode_x64::rax, reinterpret_cast<uint64_t>(func));
		OpCode_x64::call_rax(data);
	}